

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_control.c
# Opt level: O2

void INT_CMCondition_fail(CManager cm,int condition)

{
  CMControlList cl;
  CMCondition cond;
  CMControlList cl_00;
  
  cl = cm->control_list;
  cond = CMCondition_find(cl,condition);
  if (cond != (CMCondition)0x0) {
    cond->failed = 1;
    CMCondition_trigger(cm,cond,cl_00);
    if (cl->cond_polling != 0) {
      CMwake_server_thread(cm);
      return;
    }
  }
  return;
}

Assistant:

extern void
INT_CMCondition_fail(CManager cm, int condition)
{
    CMControlList cl = cm->control_list;
    CMCondition cond = CMCondition_find(cl, condition);
    if (!cond) return;
    cond->failed = 1;
    CMCondition_trigger(cm, cond, cm->control_list);

    if (cl->cond_polling) {
	/* wake the server thread in case we're not him */
	CMwake_server_thread(cm);
    }
}